

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlElement::RemoveAttribute(TiXmlElement *this,char *name)

{
  TiXmlAttribute *removeMe;
  TiXmlAttribute *node;
  char *name_local;
  TiXmlElement *this_local;
  
  removeMe = TiXmlAttributeSet::Find(&this->attributeSet,name);
  if ((removeMe != (TiXmlAttribute *)0x0) &&
     (TiXmlAttributeSet::Remove(&this->attributeSet,removeMe), removeMe != (TiXmlAttribute *)0x0)) {
    (*(removeMe->super_TiXmlBase)._vptr_TiXmlBase[1])();
  }
  return;
}

Assistant:

void TiXmlElement::RemoveAttribute(const char * name) {
#ifdef TIXML_USE_STL
	TIXML_STRING str( name );
	TiXmlAttribute* node = attributeSet.Find( str );
#else
	TiXmlAttribute* node = attributeSet.Find(name);
#endif
	if (node) {
		attributeSet.Remove(node);
		delete node;
	}
}